

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

Node<QString,_QMimeTypeXMLData> * __thiscall
QHashPrivate::Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_>::insert
          (Span<QHashPrivate::Node<QString,_QMimeTypeXMLData>_> *this,size_t i)

{
  long lVar1;
  byte bVar2;
  
  if (this->nextFree == this->allocated) {
    addStorage(this);
  }
  bVar2 = this->nextFree;
  lVar1 = (ulong)bVar2 * 0x80 + (ulong)bVar2 * 8;
  this->nextFree = (this->entries->storage).data[lVar1];
  this->offsets[i] = bVar2;
  return (Node<QString,_QMimeTypeXMLData> *)((this->entries->storage).data + lVar1);
}

Assistant:

Node *insert(size_t i)
    {
        Q_ASSERT(i < SpanConstants::NEntries);
        Q_ASSERT(offsets[i] == SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        unsigned char entry = nextFree;
        Q_ASSERT(entry < allocated);
        nextFree = entries[entry].nextFree();
        offsets[i] = entry;
        return &entries[entry].node();
    }